

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool ON_SubDVertex::Internal_GetGeneralQuadSubdivisionPoint
               (ON_SubDVertex *vertex,double *vertex_point)

{
  double *pdVar1;
  ushort uVar2;
  ON_SubDFace **ppOVar3;
  bool bVar4;
  char *sFormat;
  int line_number;
  ulong uVar5;
  ON_SubDVertex *pOVar6;
  double *pdVar7;
  ON_SubDVertex *pOVar8;
  uint uVar9;
  uint i;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  ON_3dPoint sharp_subdivision_point;
  double faceC [3];
  ON_3dPoint local_88;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double local_40;
  double dStack_38;
  
  dVar16 = ON_DBL_QNAN;
  if (vertex_point == (double *)0x0) {
    ON_SubDIncrementErrorCount();
    sFormat = "input vertex_point is nullptr.";
    line_number = 0x3af4;
  }
  else {
    *vertex_point = ON_DBL_QNAN;
    vertex_point[1] = dVar16;
    vertex_point[2] = dVar16;
    if (vertex == (ON_SubDVertex *)0x0) {
      ON_SubDIncrementErrorCount();
      sFormat = "input vertex is nullptr.";
      line_number = 0x3afe;
    }
    else {
      if ((vertex->m_faces != (ON_SubDFace **)0x0) && (vertex->m_edges != (ON_SubDEdgePtr *)0x0)) {
        uVar2 = vertex->m_face_count;
        if ((1 < uVar2) && (uVar2 == vertex->m_edge_count)) {
          local_58 = GetSharpSubdivisionPoint(vertex,&local_88);
          if (1.0 <= local_58) {
            *vertex_point = local_88.x;
            vertex_point[1] = local_88.y;
          }
          else {
            pdVar1 = vertex->m_P;
            ppOVar3 = vertex->m_faces;
            local_68 = 0.0;
            dStack_60 = 0.0;
            dVar16 = 0.0;
            uVar10 = 0;
            do {
              if ((ppOVar3[uVar10] == (ON_SubDFace *)0x0) ||
                 (bVar4 = ON_SubDFace::GetSubdivisionPoint(ppOVar3[uVar10],&local_48),
                 dVar11 = local_48, dVar12 = local_40, dVar13 = dStack_38, !bVar4)) {
                dVar11 = vertex->m_P[0];
                dVar12 = vertex->m_P[1];
                dVar13 = vertex->m_P[2];
              }
              local_68 = local_68 + dVar12;
              dStack_60 = dStack_60 + dVar13;
              dVar16 = dVar16 + dVar11;
              uVar10 = uVar10 + 1;
            } while (uVar2 != uVar10);
            uVar9 = (uint)uVar2;
            dVar11 = 0.0;
            dVar12 = 0.0;
            dVar13 = 0.0;
            uVar10 = 0;
            do {
              uVar5 = vertex->m_edges[uVar10].m_ptr & 0xfffffffffffffff8;
              pdVar7 = pdVar1;
              pOVar8 = vertex;
              if (uVar5 != 0) {
                pOVar6 = *(ON_SubDVertex **)(uVar5 + 0x88);
                if (*(ON_SubDVertex **)(uVar5 + 0x80) == vertex) {
                  if (pOVar6 != vertex) goto LAB_005d9623;
                }
                else {
                  bVar4 = pOVar6 == vertex;
                  pOVar6 = *(ON_SubDVertex **)(uVar5 + 0x80);
                  if (bVar4) {
LAB_005d9623:
                    pdVar7 = pOVar6->m_P;
                    pOVar8 = pOVar6;
                    if (pOVar6 == (ON_SubDVertex *)0x0) {
                      pdVar7 = pdVar1;
                      pOVar8 = vertex;
                    }
                  }
                }
              }
              dVar13 = dVar13 + *pdVar7;
              dVar11 = dVar11 + pOVar8->m_P[1];
              dVar12 = dVar12 + pOVar8->m_P[2];
              uVar10 = uVar10 + 1;
            } while (uVar2 != uVar10);
            dVar14 = -2.0 / (double)uVar9 + 1.0;
            dVar15 = 1.0 / (double)(uVar9 * uVar9);
            dVar16 = vertex->m_P[0] * dVar14 + (dVar16 + dVar13) * dVar15;
            *vertex_point = dVar16;
            dVar11 = vertex->m_P[1] * dVar14 + dVar15 * (local_68 + dVar11);
            vertex_point[1] = dVar11;
            dVar12 = dVar14 * vertex->m_P[2] + (dStack_60 + dVar12) * dVar15;
            vertex_point[2] = dVar12;
            if (local_58 <= 0.0) {
              return true;
            }
            dVar13 = 1.0 - local_58;
            *vertex_point = dVar16 * dVar13 + local_58 * local_88.x;
            vertex_point[1] = dVar11 * dVar13 + local_58 * local_88.y;
            local_88.z = dVar13 * dVar12 + local_88.z * local_58;
          }
          vertex_point[2] = local_88.z;
          return true;
        }
      }
      ON_SubDIncrementErrorCount();
      sFormat = "input vertex is not valid.";
      line_number = 0x3b09;
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
             ,line_number,"",sFormat);
  return false;
}

Assistant:

bool ON_SubDVertex::Internal_GetGeneralQuadSubdivisionPoint(
  const class ON_SubDVertex* vertex,
  double vertex_point[3]
)
{
  if (nullptr == vertex_point)
  {
    ON_SUBD_ERROR("input vertex_point is nullptr.");
    return false;
  }

  vertex_point[0] = ON_DBL_QNAN;
  vertex_point[1] = ON_DBL_QNAN;
  vertex_point[2] = ON_DBL_QNAN;

  if (nullptr == vertex)
  {
    ON_SUBD_ERROR("input vertex is nullptr.");
    return false;
  }

  const unsigned int n = vertex->m_face_count;
  if (nullptr == vertex->m_faces
    || nullptr == vertex->m_edges
    || vertex->m_face_count != vertex->m_edge_count
    || n < ON_SubDSectorType::MinimumSectorFaceCount(ON_SubDVertexTag::Smooth)
    )
  {
    ON_SUBD_ERROR("input vertex is not valid.");
    return false;
  }

  const double* vertexP = vertex->m_P;

  ON_3dPoint sharp_subdivision_point;
  const double vertex_sharpness = vertex->GetSharpSubdivisionPoint(sharp_subdivision_point);
  if (vertex_sharpness >= 1.0)
  {
    vertex_point[0] = sharp_subdivision_point.x;
    vertex_point[1] = sharp_subdivision_point.y;
    vertex_point[2] = sharp_subdivision_point.z;
    return true;
  }

  // It is critical to use the centroids of the neighboring faces
  // in this step because the number of edges in each face's
  // boundary may not be constant.
  double facePsum[3] = {};
  const ON_SubDFace*const* vertex_faces = vertex->m_faces;
  for (unsigned int i = 0; i < n; i++)
  {
    const ON_SubDFace* face = vertex_faces[i];
    if (nullptr != face)
    {
      double faceC[3];
      if (face->GetSubdivisionPoint( faceC))
      {
        facePsum[0] += faceC[0];
        facePsum[1] += faceC[1];
        facePsum[2] += faceC[2];
        continue;
      }
    }
    // treat missing or damaged face as infinitesimally small
    facePsum[0] += vertexP[0];
    facePsum[1] += vertexP[1];
    facePsum[2] += vertexP[2];
  }

  double edgePsum[3] = {};
  class ON_SubDEdgePtr* edges = vertex->m_edges;
  for (unsigned int i = 0; i < n; i++)
  {
    const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(edges[i].m_ptr);
    if (nullptr != edge)
    {
      const ON_SubDVertex* edge_vertex = edge->OtherEndVertex(vertex);
      if (nullptr != edge_vertex)
      {
        const double* edgeP = edge_vertex->m_P;
        edgePsum[0] += edgeP[0];
        edgePsum[1] += edgeP[1];
        edgePsum[2] += edgeP[2];
        continue;
      }
    }
    // treat missing or damaged edge as infinitesimally small
    edgePsum[0] += vertexP[0];
    edgePsum[1] += vertexP[1];
    edgePsum[2] += vertexP[2];
  }

  const double v_weight = 1.0 - 2.0 / ((double)n);
  const double ef_weight = 1.0 / ((double)(n*n));
  vertex_point[0] = v_weight*vertexP[0] + ef_weight*(edgePsum[0] + facePsum[0]);
  vertex_point[1] = v_weight*vertexP[1] + ef_weight*(edgePsum[1] + facePsum[1]);
  vertex_point[2] = v_weight*vertexP[2] + ef_weight*(edgePsum[2] + facePsum[2]);

  if (vertex_sharpness > 0.0)
  {
    // 0 < vertex_sharpness < 1
    const double a = 1.0 - vertex_sharpness;
    vertex_point[0] = a * vertex_point[0] + vertex_sharpness * sharp_subdivision_point.x;
    vertex_point[1] = a * vertex_point[1] + vertex_sharpness * sharp_subdivision_point.y;
    vertex_point[2] = a * vertex_point[2] + vertex_sharpness * sharp_subdivision_point.z;
    return true;
  }

  return true;
}